

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_material.cpp
# Opt level: O3

bool __thiscall ON_MappingChannel::Read(ON_MappingChannel *this,ON_BinaryArchive *archive)

{
  bool bVar1;
  bool bVar2;
  uint uVar3;
  long lVar4;
  ON_Xform *pOVar5;
  ON_Xform *pOVar6;
  ON_Xform *x;
  byte bVar7;
  int minor_version;
  int major_version;
  int local_30;
  int local_2c;
  
  bVar7 = 0;
  memset(this,0,0x98);
  this->m_mapping_index = -1;
  this->m_mapping_channel_id = 1;
  x = &this->m_object_xform;
  pOVar5 = &ON_Xform::IdentityTransformation;
  pOVar6 = x;
  for (lVar4 = 0x10; lVar4 != 0; lVar4 = lVar4 + -1) {
    pOVar6->m_xform[0][0] = pOVar5->m_xform[0][0];
    pOVar5 = (ON_Xform *)((long)pOVar5 + ((ulong)bVar7 * -2 + 1) * 8);
    pOVar6 = (ON_Xform *)((long)pOVar6 + (ulong)bVar7 * -0x10 + 8);
  }
  local_2c = 0;
  local_30 = 0;
  bVar1 = ON_BinaryArchive::BeginRead3dmChunk(archive,0x40008000,&local_2c,&local_30);
  if (!bVar1) {
    return false;
  }
  if ((local_2c == 1) &&
     (bVar1 = ON_BinaryArchive::ReadInt(archive,&this->m_mapping_channel_id), bVar1)) {
    bVar1 = ON_BinaryArchive::ReadUuid(archive,&this->m_mapping_id);
    if ((!bVar1) || (local_30 < 1)) goto LAB_004e01a0;
    bVar1 = ON_BinaryArchive::ReadXform(archive,x);
    if (bVar1) {
      uVar3 = ON_BinaryArchive::ArchiveOpenNURBSVersion(archive);
      bVar1 = true;
      if ((uVar3 < 0xbf510ee) && (bVar2 = ON_Xform::IsZero(x), bVar2)) {
        pOVar5 = &ON_Xform::IdentityTransformation;
        for (lVar4 = 0x10; lVar4 != 0; lVar4 = lVar4 + -1) {
          x->m_xform[0][0] = pOVar5->m_xform[0][0];
          pOVar5 = (ON_Xform *)((long)pOVar5 + ((ulong)bVar7 * -2 + 1) * 8);
          x = (ON_Xform *)((long)x + (ulong)bVar7 * -0x10 + 8);
        }
      }
      goto LAB_004e01a0;
    }
  }
  bVar1 = false;
LAB_004e01a0:
  bVar2 = ON_BinaryArchive::EndRead3dmChunk(archive);
  return (bool)(bVar2 & bVar1);
}

Assistant:

bool ON_MappingChannel::Read( ON_BinaryArchive& archive )
{
  Default();
  int major_version = 0;
  int minor_version = 0;
  bool rc = archive.BeginRead3dmChunk(TCODE_ANONYMOUS_CHUNK,&major_version,&minor_version);
  if (rc)
  {
    rc = (1 == major_version);
    if (rc) rc = archive.ReadInt(&m_mapping_channel_id);
    if (rc) rc = archive.ReadUuid(m_mapping_id);

    if ( rc && minor_version >= 1 )
    {
      // 1.1 field added 6 June 2006
      if (rc) rc = archive.ReadXform(m_object_xform);
      if (rc
          && archive.ArchiveOpenNURBSVersion() < 200610030
          && m_object_xform.IsZero()
          )
      {
        // Between versions 200606060 and 200610030,
        // there was a bug that created some mapping
        // channels with zero transformations.  This
        // if clause finds those and sets them to the
        // identity.
        m_object_xform = ON_Xform::IdentityTransformation;
      }
    }

    if ( !archive.EndRead3dmChunk() )
      rc = false;
  }
  return rc;
}